

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetWaveformAndSpectrum
               (double *x,int x_length,int y_length,double actual_fs,int fft_size,
               int decimation_ratio,double *y,fft_complex *y_spectrum)

{
  fft_plan p;
  fft_plan p_00;
  int in_ECX;
  int in_EDX;
  long in_R9;
  fft_plan forwardFFT;
  int i_3;
  int i_2;
  int i_1;
  double mean_y;
  int i;
  undefined8 in_stack_fffffffffffffea8;
  fft_complex *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  double *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  double in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  double *in_stack_ffffffffffffff00;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined1 local_d8 [72];
  undefined1 local_90 [16];
  undefined1 in_stack_ffffffffffffff80 [60];
  int iVar1;
  int iVar2;
  double local_38;
  int local_2c;
  
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    *(undefined8 *)(in_R9 + (long)local_2c * 8) = 0;
  }
  GetWaveformAndSpectrumSub
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
  local_38 = 0.0;
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    local_38 = *(double *)(in_R9 + (long)iVar2 * 8) + local_38;
  }
  for (iVar1 = 0; iVar1 < in_EDX; iVar1 = iVar1 + 1) {
    *(double *)(in_R9 + (long)iVar1 * 8) =
         *(double *)(in_R9 + (long)iVar1 * 8) - local_38 / (double)in_EDX;
  }
  for (; in_EDX < in_ECX; in_EDX = in_EDX + 1) {
    *(undefined8 *)(in_R9 + (long)in_EDX * 8) = 0;
  }
  fft_plan_dft_r2c_1d(in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                      (uint)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  memcpy(local_d8,local_90,0x48);
  p_00.ip._4_4_ = in_EDX;
  p_00._0_60_ = in_stack_ffffffffffffff80;
  p_00.w._0_4_ = iVar1;
  p_00.w._4_4_ = iVar2;
  fft_execute(p_00);
  memcpy(&stack0xfffffffffffffee0,local_90,0x48);
  p._8_8_ = local_f0;
  p._0_8_ = uStack_f8;
  p.c_in = (fft_complex *)uStack_e8;
  p.in = (double *)local_e0;
  p.c_out = (fft_complex *)in_stack_fffffffffffffee0;
  p.out._0_4_ = in_stack_fffffffffffffee8;
  p.out._4_4_ = in_stack_fffffffffffffeec;
  p.input = (double *)in_stack_fffffffffffffef0;
  p.ip._0_4_ = in_stack_fffffffffffffef8;
  p.ip._4_4_ = in_stack_fffffffffffffefc;
  p.w = in_stack_ffffffffffffff00;
  fft_destroy_plan(p);
  return;
}

Assistant:

static void GetWaveformAndSpectrum(const double *x, int x_length,
    int y_length, double actual_fs, int fft_size, int decimation_ratio,
    double *y, fft_complex *y_spectrum) {
  // Initialization
  for (int i = 0; i < fft_size; ++i) y[i] = 0.0;

  // Processing for the compatibility with MATLAB version
  GetWaveformAndSpectrumSub(x, x_length, y_length, actual_fs,
      decimation_ratio, y);

  // Removal of the DC component (y = y - mean value of y)
  double mean_y = 0.0;
  for (int i = 0; i < y_length; ++i) mean_y += y[i];
  mean_y /= y_length;
  for (int i = 0; i < y_length; ++i) y[i] -= mean_y;
  for (int i = y_length; i < fft_size; ++i) y[i] = 0.0;

  fft_plan forwardFFT =
    fft_plan_dft_r2c_1d(fft_size, y, y_spectrum, FFT_ESTIMATE);
  fft_execute(forwardFFT);

  fft_destroy_plan(forwardFFT);
}